

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createDebugLocalVariable(Builder *this,Id type,char *name,size_t argNumber)

{
  size_t __s;
  bool bVar1;
  Id IVar2;
  Id typeId;
  Instruction *pIVar3;
  reference pvVar4;
  value_type local_60;
  allocator<char> local_51;
  string local_50;
  Instruction *local_30;
  Instruction *inst;
  size_t argNumber_local;
  char *name_local;
  Builder *pBStack_10;
  Id type_local;
  Builder *this_local;
  
  inst = (Instruction *)argNumber;
  argNumber_local = (size_t)name;
  name_local._4_4_ = type;
  pBStack_10 = this;
  if (name == (char *)0x0) {
    __assert_fail("name != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x4c8,
                  "Id spv::Builder::createDebugLocalVariable(Id, const char *const, const size_t)");
  }
  bVar1 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::empty
                    (&this->currentDebugScopeId);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!currentDebugScopeId.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x4c9,
                  "Id spv::Builder::createDebugLocalVariable(Id, const char *const, const size_t)");
  }
  pIVar3 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  typeId = makeVoidType(this);
  spv::Instruction::Instruction(pIVar3,IVar2,typeId,OpExtInst);
  local_30 = pIVar3;
  spv::Instruction::reserveOperands(pIVar3,9);
  spv::Instruction::addIdOperand(local_30,this->nonSemanticShaderDebugInfo);
  spv::Instruction::addImmediateOperand(local_30,0x1a);
  __s = argNumber_local;
  pIVar3 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_51);
  IVar2 = getStringId(this,&local_50);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  spv::Instruction::addIdOperand(local_30,name_local._4_4_);
  pIVar3 = local_30;
  IVar2 = makeDebugSource(this,this->currentFileId);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = local_30;
  IVar2 = makeUintConstant(this,this->currentLine,false);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = local_30;
  IVar2 = makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = local_30;
  pvVar4 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::top
                     (&this->currentDebugScopeId);
  spv::Instruction::addIdOperand(pIVar3,*pvVar4);
  pIVar3 = local_30;
  IVar2 = makeUintConstant(this,4,false);
  spv::Instruction::addIdOperand(pIVar3,IVar2);
  pIVar3 = local_30;
  if (inst != (Instruction *)0x0) {
    IVar2 = makeUintConstant(this,(uint)inst,false);
    spv::Instruction::addIdOperand(pIVar3,IVar2);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_60,
             local_30);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_60);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_60);
  Module::mapInstruction(&this->module,local_30);
  IVar2 = spv::Instruction::getResultId(local_30);
  return IVar2;
}

Assistant:

Id Builder::createDebugLocalVariable(Id type, char const*const name, size_t const argNumber)
{
    assert(name != nullptr);
    assert(!currentDebugScopeId.empty());

    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(9);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugLocalVariable);
    inst->addIdOperand(getStringId(name)); // name id
    inst->addIdOperand(type); // type id
    inst->addIdOperand(makeDebugSource(currentFileId)); // source id
    inst->addIdOperand(makeUintConstant(currentLine)); // line id
    inst->addIdOperand(makeUintConstant(0)); // TODO: column id
    inst->addIdOperand(currentDebugScopeId.top()); // scope id
    inst->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsLocal)); // flags id
    if(argNumber != 0) {
        inst->addIdOperand(makeUintConstant(argNumber));
    }

    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
    module.mapInstruction(inst);

    return inst->getResultId();
}